

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_lua.cpp
# Opt level: O2

string * __thiscall
flatbuffers::(anonymous_namespace)::LuaBfbsGenerator::GenerateMethod_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Field *field)

{
  BaseType BVar1;
  Type *this_00;
  BaseType base_type;
  char *__s;
  string local_40;
  
  this_00 = reflection::Field::type(field);
  BVar1 = reflection::Type::base_type(this_00);
  if (BVar1 - UType < 0xc) {
    GenerateType_abi_cxx11_(&local_40,(void *)(ulong)BVar1,base_type);
    (**(code **)(*(long *)((long)this + 0xe8) + 0xa0))
              (__return_storage_ptr__,(long)this + 0xe8,&local_40,*(undefined4 *)((long)this + 0xf0)
              );
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    if (BVar1 == Obj) {
      __s = "Struct";
    }
    else {
      __s = "UOffsetTRelative";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateMethod(const r::Field *field) const {
    const r::BaseType base_type = field->type()->base_type();
    if (IsScalar(base_type)) { return namer_.Type(GenerateType(base_type)); }
    if (IsStructOrTable(base_type)) { return "Struct"; }
    return "UOffsetTRelative";
  }